

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O1

void __thiscall MxxReduce_Scan_Test::~MxxReduce_Scan_Test(MxxReduce_Scan_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxReduce, Scan) {
    mxx::comm c;

    int r = c.rank()*2;
    int g = mxx::scan(r);
    ASSERT_EQ(c.rank()*(c.rank()+1), g);
    int m = mxx::exscan(r, mxx::max<int>());
    if (r != 0) {
        ASSERT_EQ((c.rank()-1)*2, m);
    }
    int m2 = mxx::exscan(r, mxx::max<int>(), c.split(c.rank() % 3));
    if (c.rank() >= 3) {
        ASSERT_EQ((c.rank()-3)*2, m2);
    }
}